

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v6::internal::grisu_shortest_handler::on_digit
          (grisu_shortest_handler *this,char digit,uint64_t divisor,uint64_t remainder,
          uint64_t error,int exp,bool integral)

{
  int iVar1;
  ulong uVar2;
  ulong in_RCX;
  ulong in_RDX;
  char in_SIL;
  grisu_shortest_handler *in_RDI;
  ulong in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  byte in_stack_00000008;
  uint64_t down;
  uint64_t up;
  uint64_t unit;
  long local_60;
  result local_4;
  
  iVar1 = in_RDI->size;
  in_RDI->size = iVar1 + 1;
  in_RDI->buf[iVar1] = in_SIL;
  if (in_RCX < in_R8) {
    if ((in_stack_00000008 & 1) == 0) {
      local_60 = *(long *)(basic_data<void>::powers_of_10_64 + (long)-in_R9D * 8);
    }
    else {
      local_60 = 1;
    }
    round(in_RDI,in_XMM0_Qa);
    uVar2 = (in_RDI->diff + 1) * local_60;
    if (((in_RCX < uVar2) && (in_RDX <= in_R8 - in_RCX)) &&
       ((in_RCX + in_RDX < uVar2 || ((in_RCX + in_RDX) - uVar2 < uVar2 - in_RCX)))) {
      local_4 = error;
    }
    else {
      local_4 = error;
      if (((ulong)(local_60 * 2) < in_RCX || local_60 * 2 - in_RCX == 0) &&
          in_RCX <= in_R8 + local_60 * -4) {
        local_4 = done;
      }
    }
  }
  else {
    local_4 = more;
  }
  return local_4;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int exp, bool integral) {
    buf[size++] = digit;
    if (remainder >= error) return digits::more;
    uint64_t unit = integral ? 1 : data::powers_of_10_64[-exp];
    uint64_t up = (diff - 1) * unit;  // wp_Wup
    round(up, divisor, remainder, error);
    uint64_t down = (diff + 1) * unit;  // wp_Wdown
    if (remainder < down && error - remainder >= divisor &&
        (remainder + divisor < down ||
         down - remainder > remainder + divisor - down)) {
      return digits::error;
    }
    return 2 * unit <= remainder && remainder <= error - 4 * unit
               ? digits::done
               : digits::error;
  }